

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O1

void __thiscall
baryonyx::itm::debug_logger<true>::log<int,unsigned_long,int,int>
          (debug_logger<true> *this,string_view fmt,int *args,unsigned_long *args_1,int *args_2,
          int *args_3)

{
  format_args args_00;
  string_view format_str;
  ulong local_48 [2];
  unsigned_long local_38;
  ulong local_28;
  ulong local_18;
  
  local_48[0] = (ulong)(uint)*args;
  local_38 = *args_1;
  local_28 = (ulong)(uint)*args_2;
  local_18 = (ulong)(uint)*args_3;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ =
       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
       local_48;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = 0x1141;
  format_str.size_ = fmt._M_len;
  format_str.data_ = fmt._M_str;
  ::fmt::v7::vprint(this->ofs,format_str,args_00);
  return;
}

Assistant:

void log([[maybe_unused]] const std::string_view fmt,
             [[maybe_unused]] const Args&... args) const noexcept
    {
        if constexpr (debug) {
            fmt::print(ofs, fmt, args...);
        }
    }